

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_usage.cpp
# Opt level: O0

bool init_vulkan(void)

{
  bool bVar1;
  VkResult __val;
  InstanceBuilder *pIVar2;
  ostream *poVar3;
  Instance *pIVar4;
  VkInstance instance;
  PhysicalDeviceSelector *pPVar5;
  PhysicalDevice *pPVar6;
  Device *pDVar7;
  Swapchain *pSVar8;
  fd_set *__writefds;
  fd_set *__readfds;
  fd_set *__exceptfds;
  timeval *in_R9;
  error_code eVar9;
  undefined1 auStack_2968 [8];
  Swapchain vkb_swapchain;
  error_code local_2900;
  string local_28f0;
  undefined1 local_28d0 [8];
  Result<vkb::Swapchain> swap_ret;
  SwapchainBuilder swapchain_builder;
  VkQueue graphics_queue;
  error_category *local_27a8;
  string local_27a0;
  undefined1 local_2780 [8];
  Result<VkQueue_T_*> graphics_queue_ret;
  VkDevice device;
  Device vkb_device;
  string local_2038;
  undefined1 local_2018 [8];
  Result<vkb::Device> dev_ret;
  undefined1 local_1240 [8];
  DeviceBuilder device_builder;
  string local_b30;
  undefined1 local_b10 [8];
  Result<vkb::PhysicalDevice> phys_ret;
  PhysicalDeviceSelector selector;
  undefined1 auStack_1c8 [4];
  VkResult glfw_result;
  VkSurfaceKHR surface;
  GLFWwindow *window;
  Instance vkb_inst;
  error_code local_178;
  string local_168;
  undefined1 local_138 [8];
  Result<vkb::Instance> inst_ret;
  InstanceBuilder builder;
  
  vkb::InstanceBuilder::InstanceBuilder((InstanceBuilder *)&inst_ret.m_init);
  pIVar2 = vkb::InstanceBuilder::set_app_name
                     ((InstanceBuilder *)&inst_ret.m_init,"Example Vulkan Application");
  pIVar2 = vkb::InstanceBuilder::request_validation_layers(pIVar2,true);
  pIVar2 = vkb::InstanceBuilder::use_default_debug_messenger(pIVar2);
  vkb::InstanceBuilder::build((Result<vkb::Instance> *)local_138,pIVar2);
  bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_138);
  if (bVar1) {
    pIVar4 = vkb::Result<vkb::Instance>::value((Result<vkb::Instance> *)local_138);
    vkb_inst._40_8_ = *(undefined8 *)&pIVar4->headless;
    window = (GLFWwindow *)pIVar4->instance;
    vkb_inst.instance = (VkInstance)pIVar4->debug_messenger;
    vkb_inst.debug_messenger = (VkDebugUtilsMessengerEXT)pIVar4->allocation_callbacks;
    vkb_inst.allocation_callbacks = (VkAllocationCallbacks *)pIVar4->fp_vkGetInstanceProcAddr;
    vkb_inst.fp_vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)pIVar4->fp_vkGetDeviceProcAddr;
    vkb_inst.fp_vkGetDeviceProcAddr = *(PFN_vkGetDeviceProcAddr *)&pIVar4->instance_version;
    glfwInit();
    glfwWindowHint(0x22001,0);
    __exceptfds = (fd_set *)0x0;
    surface = (VkSurfaceKHR)
              glfwCreateWindow(0x400,0x400,"Vulkan Triangle",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    _auStack_1c8 = (VkSurfaceKHR)0x0;
    instance = vkb::Instance::operator_cast_to_VkInstance_T_((Instance *)&window);
    __writefds = (fd_set *)auStack_1c8;
    __val = glfwCreateWindowSurface
                      (instance,(GLFWwindow *)surface,(VkAllocationCallbacks *)0x0,
                       (VkSurfaceKHR_conflict *)__writefds);
    if (__val == VK_SUCCESS) {
      vkb::PhysicalDeviceSelector::PhysicalDeviceSelector
                ((PhysicalDeviceSelector *)&phys_ret.m_init,(Instance *)&window);
      pPVar5 = vkb::PhysicalDeviceSelector::set_surface
                         ((PhysicalDeviceSelector *)&phys_ret.m_init,_auStack_1c8);
      vkb::PhysicalDeviceSelector::select
                ((PhysicalDeviceSelector *)local_b10,(int)pPVar5,__readfds,__writefds,__exceptfds,
                 in_R9);
      bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_b10);
      if (bVar1) {
        pPVar6 = vkb::Result<vkb::PhysicalDevice>::value((Result<vkb::PhysicalDevice> *)local_b10);
        vkb::PhysicalDevice::PhysicalDevice((PhysicalDevice *)&dev_ret.m_init,pPVar6);
        vkb::DeviceBuilder::DeviceBuilder
                  ((DeviceBuilder *)local_1240,(PhysicalDevice *)&dev_ret.m_init);
        vkb::PhysicalDevice::~PhysicalDevice((PhysicalDevice *)&dev_ret.m_init);
        vkb::DeviceBuilder::build((Result<vkb::Device> *)local_2018,(DeviceBuilder *)local_1240);
        bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_2018);
        if (bVar1) {
          pDVar7 = vkb::Result<vkb::Device>::value((Result<vkb::Device> *)local_2018);
          vkb::Device::Device((Device *)&device,pDVar7);
          graphics_queue_ret._24_8_ = device;
          vkb::Device::get_queue((Result<VkQueue_T_*> *)local_2780,(Device *)&device,graphics);
          bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_2780);
          if (bVar1) {
            vkb::Result<VkQueue_T_*>::value((Result<VkQueue_T_*> *)local_2780);
            vkb::SwapchainBuilder::SwapchainBuilder
                      ((SwapchainBuilder *)&swap_ret.m_init,(Device *)&device);
            vkb::SwapchainBuilder::build
                      ((Result<vkb::Swapchain> *)local_28d0,(SwapchainBuilder *)&swap_ret.m_init);
            builder.info.fp_vkGetInstanceProcAddr._7_1_ =
                 vkb::Result::operator_cast_to_bool((Result *)local_28d0);
            if (builder.info.fp_vkGetInstanceProcAddr._7_1_) {
              pSVar8 = vkb::Result<vkb::Swapchain>::value((Result<vkb::Swapchain> *)local_28d0);
              vkb_swapchain.internal_table.fp_vkCreateImageView =
                   (PFN_vkCreateImageView)(pSVar8->internal_table).fp_vkDestroyImageView;
              vkb_swapchain.internal_table.fp_vkDestroyImageView =
                   (PFN_vkDestroyImageView)(pSVar8->internal_table).fp_vkDestroySwapchainKHR;
              vkb_swapchain.allocation_callbacks =
                   (VkAllocationCallbacks *)(pSVar8->internal_table).fp_vkGetSwapchainImagesKHR;
              vkb_swapchain.internal_table.fp_vkGetSwapchainImagesKHR =
                   (PFN_vkGetSwapchainImagesKHR)(pSVar8->internal_table).fp_vkCreateImageView;
              auStack_2968 = (undefined1  [8])pSVar8->device;
              vkb_swapchain.device = (VkDevice)pSVar8->swapchain;
              vkb_swapchain.swapchain = *(VkSwapchainKHR *)&pSVar8->image_count;
              vkb_swapchain.image_count = pSVar8->color_space;
              vkb_swapchain.image_format = pSVar8->image_usage_flags;
              vkb_swapchain._24_8_ = pSVar8->extent;
              vkb_swapchain.extent.width = pSVar8->requested_min_image_count;
              vkb_swapchain.extent.height = pSVar8->present_mode;
              vkb_swapchain.requested_min_image_count = pSVar8->instance_version;
              vkb_swapchain.present_mode = *(VkPresentModeKHR *)&pSVar8->field_0x34;
              vkb_swapchain._48_8_ = pSVar8->allocation_callbacks;
              vkb::destroy_swapchain((Swapchain *)auStack_2968);
              vkb::destroy_device((Device *)&device);
              vkb::destroy_surface((Instance *)&window,_auStack_1c8);
              vkb::destroy_instance((Instance *)&window);
              glfwDestroyWindow((GLFWwindow *)surface);
              glfwTerminate();
            }
            else {
              eVar9 = vkb::Result<vkb::Swapchain>::error((Result<vkb::Swapchain> *)local_28d0);
              local_2900._M_cat = eVar9._M_cat;
              local_2900._M_value = eVar9._M_value;
              std::error_code::message_abi_cxx11_(&local_28f0,&local_2900);
              poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_28f0);
              std::operator<<(poVar3,"\n");
              std::__cxx11::string::~string((string *)&local_28f0);
            }
            vkb_inst._52_4_ = 1;
            vkb::Result<vkb::Swapchain>::~Result((Result<vkb::Swapchain> *)local_28d0);
            vkb::SwapchainBuilder::~SwapchainBuilder((SwapchainBuilder *)&swap_ret.m_init);
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to get graphics queue. Error: ");
            eVar9 = vkb::Result<VkQueue_T_*>::error((Result<VkQueue_T_*> *)local_2780);
            local_27a8 = eVar9._M_cat;
            graphics_queue._0_4_ = eVar9._M_value;
            std::error_code::message_abi_cxx11_(&local_27a0,(error_code *)&graphics_queue);
            poVar3 = std::operator<<(poVar3,(string *)&local_27a0);
            std::operator<<(poVar3,"\n");
            std::__cxx11::string::~string((string *)&local_27a0);
            builder.info.fp_vkGetInstanceProcAddr._7_1_ = false;
            vkb_inst._52_4_ = 1;
          }
          vkb::Result<VkQueue_T_*>::~Result((Result<VkQueue_T_*> *)local_2780);
          vkb::Device::~Device((Device *)&device);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to create Vulkan device. Error: ");
          eVar9 = vkb::Result<vkb::Device>::error((Result<vkb::Device> *)local_2018);
          vkb_device.internal_table.fp_vkDestroyDevice._0_4_ = eVar9._M_value;
          std::error_code::message_abi_cxx11_
                    (&local_2038,(error_code *)&vkb_device.internal_table.fp_vkDestroyDevice);
          poVar3 = std::operator<<(poVar3,(string *)&local_2038);
          std::operator<<(poVar3,"\n");
          std::__cxx11::string::~string((string *)&local_2038);
          builder.info.fp_vkGetInstanceProcAddr._7_1_ = false;
          vkb_inst._52_4_ = 1;
        }
        vkb::Result<vkb::Device>::~Result((Result<vkb::Device> *)local_2018);
        vkb::DeviceBuilder::~DeviceBuilder((DeviceBuilder *)local_1240);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Failed to select Vulkan Physical Device. Error: ");
        eVar9 = vkb::Result<vkb::PhysicalDevice>::error((Result<vkb::PhysicalDevice> *)local_b10);
        device_builder.info.allocation_callbacks._0_4_ = eVar9._M_value;
        std::error_code::message_abi_cxx11_
                  (&local_b30,(error_code *)&device_builder.info.allocation_callbacks);
        poVar3 = std::operator<<(poVar3,(string *)&local_b30);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_b30);
        builder.info.fp_vkGetInstanceProcAddr._7_1_ = false;
        vkb_inst._52_4_ = 1;
      }
      vkb::Result<vkb::PhysicalDevice>::~Result((Result<vkb::PhysicalDevice> *)local_b10);
      vkb::PhysicalDeviceSelector::~PhysicalDeviceSelector
                ((PhysicalDeviceSelector *)&phys_ret.m_init);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Failed to select create window surface. Error: ");
      std::__cxx11::to_string((string *)&selector.criteria.defer_surface_initialization,__val);
      poVar3 = std::operator<<(poVar3,(string *)&selector.criteria.defer_surface_initialization);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&selector.criteria.defer_surface_initialization);
      builder.info.fp_vkGetInstanceProcAddr._7_1_ = false;
      vkb_inst._52_4_ = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to create Vulkan instance. Error: ");
    eVar9 = vkb::Result<vkb::Instance>::error((Result<vkb::Instance> *)local_138);
    local_178._M_cat = eVar9._M_cat;
    local_178._M_value = eVar9._M_value;
    std::error_code::message_abi_cxx11_(&local_168,&local_178);
    poVar3 = std::operator<<(poVar3,(string *)&local_168);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_168);
    builder.info.fp_vkGetInstanceProcAddr._7_1_ = false;
    vkb_inst._52_4_ = 1;
  }
  vkb::Result<vkb::Instance>::~Result((Result<vkb::Instance> *)local_138);
  vkb::InstanceBuilder::~InstanceBuilder((InstanceBuilder *)&inst_ret.m_init);
  return builder.info.fp_vkGetInstanceProcAddr._7_1_;
}

Assistant:

bool init_vulkan() {
    vkb::InstanceBuilder builder;
    auto inst_ret =
        builder.set_app_name("Example Vulkan Application").request_validation_layers().use_default_debug_messenger().build();
    if (!inst_ret) {
        std::cerr << "Failed to create Vulkan instance. Error: " << inst_ret.error().message() << "\n";
        return false;
    }
    vkb::Instance vkb_inst = inst_ret.value();

    glfwInit();
    glfwWindowHint(GLFW_CLIENT_API, GLFW_NO_API);
    GLFWwindow* window = glfwCreateWindow(1024, 1024, "Vulkan Triangle", NULL, NULL);

    VkSurfaceKHR surface = VK_NULL_HANDLE;
    VkResult glfw_result = glfwCreateWindowSurface(vkb_inst, window, nullptr, &surface);
    if (glfw_result != VK_SUCCESS) {
        std::cerr << "Failed to select create window surface. Error: " << std::to_string(glfw_result) << "\n";
        return false;
    }

    vkb::PhysicalDeviceSelector selector{ vkb_inst };
    auto phys_ret = selector.set_surface(surface).select();
    if (!phys_ret) {
        std::cerr << "Failed to select Vulkan Physical Device. Error: " << phys_ret.error().message() << "\n";
        return false;
    }

    vkb::DeviceBuilder device_builder{ phys_ret.value() };
    // automatically propagate needed data from instance & physical device
    auto dev_ret = device_builder.build();
    if (!dev_ret) {
        std::cerr << "Failed to create Vulkan device. Error: " << dev_ret.error().message() << "\n";
        return false;
    }
    vkb::Device vkb_device = dev_ret.value();

    // Get the VkDevice handle used in the rest of a vulkan application
    VkDevice device = vkb_device.device;

    // Get the graphics queue with a helper function
    auto graphics_queue_ret = vkb_device.get_queue(vkb::QueueType::graphics);
    if (!graphics_queue_ret) {
        std::cerr << "Failed to get graphics queue. Error: " << graphics_queue_ret.error().message() << "\n";
        return false;
    }
    VkQueue graphics_queue = graphics_queue_ret.value();

    vkb::SwapchainBuilder swapchain_builder{ vkb_device };
    auto swap_ret = swapchain_builder.build();
    if (!swap_ret) {
        std::cout << swap_ret.error().message() << "\n";
        return false;
    }
    vkb::Swapchain vkb_swapchain = swap_ret.value();

    // We did it!
    // Turned 400-500 lines of boilerplate into a fraction of that.

    // Time to cleanup
    vkb::destroy_swapchain(vkb_swapchain);
    vkb::destroy_device(vkb_device);
    vkb::destroy_surface(vkb_inst, surface);
    vkb::destroy_instance(vkb_inst);
    glfwDestroyWindow(window);
    glfwTerminate();
    (void)device; // silence unused warning
    (void)graphics_queue;
    return true;
}